

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateEqualsAndHashCode
          (ImmutableMessageGenerator *this,Printer *printer)

{
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this_00;
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *this_01;
  Descriptor *pDVar1;
  OneofDescriptor *pOVar2;
  bool bVar3;
  FieldDescriptor *pFVar4;
  FieldGeneratorInfo *pFVar5;
  ImmutableFieldGenerator *pIVar6;
  reference ppVar7;
  OneofGeneratorInfo *pOVar8;
  AlphaNum *a;
  char *pcVar9;
  AlphaNum *a_00;
  int i;
  int iVar10;
  int j;
  iterator iVar11;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  string_view text_22;
  string_view text_23;
  string_view text_24;
  string_view text_25;
  string_view text_26;
  string_view text_27;
  string_view text_28;
  string_view text_29;
  string_view text_30;
  size_t sStack_c0;
  iterator local_a0;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
  local_90;
  string local_80;
  AlphaNum local_60;
  
  text._M_str = "@java.lang.Override\npublic boolean equals(";
  text._M_len = 0x2a;
  io::Printer::Print<>(printer,text);
  if ((this->context_->options_).opensource_runtime == false) {
    text_00._M_str = "@com.google.protobuf.Internal.ProtoMethodAcceptsNullParameter\n";
    text_00._M_len = 0x3e;
    io::Printer::Print<>(printer,text_00);
  }
  text_01._M_str = "final java.lang.Object obj) {\n";
  text_01._M_len = 0x1e;
  io::Printer::Print<>(printer,text_01);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&local_60,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  text_02._M_str =
       "if (obj == this) {\n return true;\n}\nif (!(obj instanceof $classname$)) {\n  return super.equals(obj);\n}\n$classname$ other = ($classname$) obj;\n\n"
  ;
  text_02._M_len = 0x8e;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_02,(char (*) [10])0xff9b1e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  this_00 = &this->field_generators_;
  for (iVar10 = 0; pDVar1 = (this->super_MessageGenerator).descriptor_,
      iVar10 < pDVar1->field_count_; iVar10 = iVar10 + 1) {
    pFVar4 = Descriptor::field(pDVar1,iVar10);
    bVar3 = IsRealOneof(pFVar4);
    if (!bVar3) {
      pFVar5 = Context::GetFieldGeneratorInfo(this->context_,pFVar4);
      bVar3 = FieldDescriptor::has_presence(pFVar4);
      if (bVar3) {
        text_03._M_str = "if (has$name$() != other.has$name$()) return false;\nif (has$name$()) {\n"
        ;
        text_03._M_len = 0x47;
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,text_03,(char (*) [5])0xd8d1e3,&pFVar5->capitalized_name);
        printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
      }
      pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (this_00,pFVar4);
      (*(pIVar6->super_FieldGenerator)._vptr_FieldGenerator[0x12])(pIVar6,printer);
      bVar3 = FieldDescriptor::has_presence(pFVar4);
      if (bVar3) {
        io::Printer::Outdent(printer);
        text_04._M_str = "}\n";
        text_04._M_len = 2;
        io::Printer::Print<>(printer,text_04);
      }
    }
  }
  this_01 = &(this->super_MessageGenerator).oneofs_;
  iVar11 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                    *)this_01);
  local_90.node_ =
       (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
        *)iVar11.node_;
  local_90.position_ = iVar11.position_;
  iVar11 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                  *)this_01);
  local_a0.node_ = iVar11.node_;
  local_a0.position_ = iVar11.position_;
  while( true ) {
    bVar3 = absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
            ::operator!=(&local_90,&local_a0);
    if (!bVar3) break;
    ppVar7 = absl::lts_20250127::container_internal::
             btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
             ::operator*(&local_90);
    pOVar2 = ppVar7->second;
    pOVar8 = Context::GetOneofGeneratorInfo(this->context_,pOVar2);
    text_05._M_str =
         "if (!get$oneof_capitalized_name$Case().equals(other.get$oneof_capitalized_name$Case())) return false;\n"
    ;
    text_05._M_len = 0x66;
    io::Printer::Print<char[23],std::__cxx11::string>
              (printer,text_05,(char (*) [23])"oneof_capitalized_name",&pOVar8->capitalized_name);
    pOVar8 = Context::GetOneofGeneratorInfo(this->context_,pOVar2);
    text_06._M_str = "switch ($oneof_name$Case_) {\n";
    text_06._M_len = 0x1d;
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,text_06,(char (*) [11])0xfd8e92,&pOVar8->name);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    for (iVar10 = 0; iVar10 < pOVar2->field_count_; iVar10 = iVar10 + 1) {
      pFVar4 = OneofDescriptor::field(pOVar2,iVar10);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_60,pFVar4->number_);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_80,(lts_20250127 *)&local_60,a);
      text_07._M_str = "case $field_number$:\n";
      text_07._M_len = 0x15;
      io::Printer::Print<char[13],std::__cxx11::string>
                (printer,text_07,(char (*) [13])0xfccc5b,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
      pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (this_00,pFVar4);
      (*(pIVar6->super_FieldGenerator)._vptr_FieldGenerator[0x12])(pIVar6,printer);
      text_08._M_str = "break;\n";
      text_08._M_len = 7;
      io::Printer::Print<>(printer,text_08);
      io::Printer::Outdent(printer);
    }
    text_09._M_str = "case 0:\ndefault:\n";
    text_09._M_len = 0x11;
    io::Printer::Print<>(printer,text_09);
    io::Printer::Outdent(printer);
    text_10._M_str = "}\n";
    text_10._M_len = 2;
    io::Printer::Print<>(printer,text_10);
    absl::lts_20250127::container_internal::
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
    ::increment(&local_90);
  }
  text_11._M_str = "if (!getUnknownFields().equals(other.getUnknownFields())) return false;\n";
  text_11._M_len = 0x48;
  io::Printer::Print<>(printer,text_11);
  if (0 < ((this->super_MessageGenerator).descriptor_)->extension_range_count_) {
    text_12._M_str =
         "if (!getExtensionFields().equals(other.getExtensionFields()))\n  return false;\n";
    text_12._M_len = 0x4e;
    io::Printer::Print<>(printer,text_12);
  }
  text_13._M_str = "return true;\n";
  text_13._M_len = 0xd;
  io::Printer::Print<>(printer,text_13);
  io::Printer::Outdent(printer);
  text_14._M_str = "}\n\n";
  text_14._M_len = 3;
  io::Printer::Print<>(printer,text_14);
  text_15._M_str = "@java.lang.Override\npublic int hashCode() {\n";
  text_15._M_len = 0x2c;
  io::Printer::Print<>(printer,text_15);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  text_16._M_str = "if (memoizedHashCode != 0) {\n";
  text_16._M_len = 0x1d;
  io::Printer::Print<>(printer,text_16);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  text_17._M_str = "return memoizedHashCode;\n";
  text_17._M_len = 0x19;
  io::Printer::Print<>(printer,text_17);
  io::Printer::Outdent(printer);
  text_18._M_str = "}\nint hash = 41;\n";
  text_18._M_len = 0x11;
  io::Printer::Print<>(printer,text_18);
  if ((((this->super_MessageGenerator).descriptor_)->options_->field_0)._impl_.
      no_standard_descriptor_accessor_ == true) {
    pcVar9 = "hash = (19 * hash) + getDescriptorForType().hashCode();\n";
    sStack_c0 = 0x38;
  }
  else {
    pcVar9 = "hash = (19 * hash) + getDescriptor().hashCode();\n";
    sStack_c0 = 0x31;
  }
  text_19._M_str = pcVar9;
  text_19._M_len = sStack_c0;
  io::Printer::Print<>(printer,text_19);
  for (iVar10 = 0; pDVar1 = (this->super_MessageGenerator).descriptor_,
      iVar10 < pDVar1->field_count_; iVar10 = iVar10 + 1) {
    pFVar4 = Descriptor::field(pDVar1,iVar10);
    bVar3 = IsRealOneof(pFVar4);
    if (!bVar3) {
      pFVar5 = Context::GetFieldGeneratorInfo(this->context_,pFVar4);
      bVar3 = FieldDescriptor::has_presence(pFVar4);
      if (bVar3) {
        text_20._M_str = "if (has$name$()) {\n";
        text_20._M_len = 0x13;
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,text_20,(char (*) [5])0xd8d1e3,&pFVar5->capitalized_name);
        printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
      }
      pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (this_00,pFVar4);
      (*(pIVar6->super_FieldGenerator)._vptr_FieldGenerator[0x13])(pIVar6,printer);
      bVar3 = FieldDescriptor::has_presence(pFVar4);
      if (bVar3) {
        io::Printer::Outdent(printer);
        text_21._M_str = "}\n";
        text_21._M_len = 2;
        io::Printer::Print<>(printer,text_21);
      }
    }
  }
  iVar11 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                    *)this_01);
  local_90.node_ =
       (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
        *)iVar11.node_;
  local_90.position_ = iVar11.position_;
  iVar11 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                  *)this_01);
  local_a0.node_ = iVar11.node_;
  local_a0.position_ = iVar11.position_;
  while( true ) {
    bVar3 = absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
            ::operator!=(&local_90,&local_a0);
    if (!bVar3) break;
    ppVar7 = absl::lts_20250127::container_internal::
             btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
             ::operator*(&local_90);
    pOVar2 = ppVar7->second;
    pOVar8 = Context::GetOneofGeneratorInfo(this->context_,pOVar2);
    text_22._M_str = "switch ($oneof_name$Case_) {\n";
    text_22._M_len = 0x1d;
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,text_22,(char (*) [11])0xfd8e92,&pOVar8->name);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    for (iVar10 = 0; iVar10 < pOVar2->field_count_; iVar10 = iVar10 + 1) {
      pFVar4 = OneofDescriptor::field(pOVar2,iVar10);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_60,pFVar4->number_);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_80,(lts_20250127 *)&local_60,a_00);
      text_23._M_str = "case $field_number$:\n";
      text_23._M_len = 0x15;
      io::Printer::Print<char[13],std::__cxx11::string>
                (printer,text_23,(char (*) [13])0xfccc5b,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
      pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (this_00,pFVar4);
      (*(pIVar6->super_FieldGenerator)._vptr_FieldGenerator[0x13])(pIVar6,printer);
      text_24._M_str = "break;\n";
      text_24._M_len = 7;
      io::Printer::Print<>(printer,text_24);
      io::Printer::Outdent(printer);
    }
    text_25._M_str = "case 0:\ndefault:\n";
    text_25._M_len = 0x11;
    io::Printer::Print<>(printer,text_25);
    io::Printer::Outdent(printer);
    text_26._M_str = "}\n";
    text_26._M_len = 2;
    io::Printer::Print<>(printer,text_26);
    absl::lts_20250127::container_internal::
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
    ::increment(&local_90);
  }
  if (0 < ((this->super_MessageGenerator).descriptor_)->extension_range_count_) {
    text_27._M_str = "hash = hashFields(hash, getExtensionFields());\n";
    text_27._M_len = 0x2f;
    io::Printer::Print<>(printer,text_27);
  }
  text_28._M_str = "hash = (29 * hash) + getUnknownFields().hashCode();\n";
  text_28._M_len = 0x34;
  io::Printer::Print<>(printer,text_28);
  text_29._M_str = "memoizedHashCode = hash;\nreturn hash;\n";
  text_29._M_len = 0x26;
  io::Printer::Print<>(printer,text_29);
  io::Printer::Outdent(printer);
  text_30._M_str = "}\n\n";
  text_30._M_len = 3;
  io::Printer::Print<>(printer,text_30);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateEqualsAndHashCode(
    io::Printer* printer) {
  printer->Print(
      "@java.lang.Override\n"
      "public boolean equals(");
  if (!context_->options().opensource_runtime) {
    printer->Print(
        "@com.google.protobuf.Internal.ProtoMethodAcceptsNullParameter\n");
  }
  printer->Print("final java.lang.Object obj) {\n");
  printer->Indent();
  printer->Print(
      "if (obj == this) {\n"
      " return true;\n"
      "}\n"
      "if (!(obj instanceof $classname$)) {\n"
      // don't simply return false because mutable and immutable types
      // can be equal
      "  return super.equals(obj);\n"
      "}\n"
      "$classname$ other = ($classname$) obj;\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!IsRealOneof(field)) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      if (field->has_presence()) {
        printer->Print(
            "if (has$name$() != other.has$name$()) return false;\n"
            "if (has$name$()) {\n",
            "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateEqualsCode(printer);
      if (field->has_presence()) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Compare oneofs.
  for (const auto& kv : oneofs_) {
    const OneofDescriptor* oneof = kv.second;
    printer->Print(
        "if (!get$oneof_capitalized_name$Case().equals("
        "other.get$oneof_capitalized_name$Case())) return false;\n",
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name);
    printer->Print("switch ($oneof_name$Case_) {\n", "oneof_name",
                   context_->GetOneofGeneratorInfo(oneof)->name);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("case $field_number$:\n", "field_number",
                     absl::StrCat(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateEqualsCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
        "case 0:\n"
        "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  // Always consider unknown fields for equality. This will sometimes return
  // false for non-canonical ordering when running in LITE_RUNTIME but it's
  // the best we can do.
  printer->Print(
      "if (!getUnknownFields().equals(other.getUnknownFields())) return "
      "false;\n");
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "if (!getExtensionFields().equals(other.getExtensionFields()))\n"
        "  return false;\n");
  }
  printer->Print("return true;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(
      "@java.lang.Override\n"
      "public int hashCode() {\n");
  printer->Indent();
  printer->Print("if (memoizedHashCode != 0) {\n");
  printer->Indent();
  printer->Print("return memoizedHashCode;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "int hash = 41;\n");

  // If we output a getDescriptor() method, use that as it is more efficient.
  if (descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print("hash = (19 * hash) + getDescriptorForType().hashCode();\n");
  } else {
    printer->Print("hash = (19 * hash) + getDescriptor().hashCode();\n");
  }

  // hashCode non-oneofs.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!IsRealOneof(field)) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      if (field->has_presence()) {
        printer->Print("if (has$name$()) {\n", "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateHashCode(printer);
      if (field->has_presence()) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // hashCode oneofs.
  for (const auto& kv : oneofs_) {
    const OneofDescriptor* oneof = kv.second;
    printer->Print("switch ($oneof_name$Case_) {\n", "oneof_name",
                   context_->GetOneofGeneratorInfo(oneof)->name);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("case $field_number$:\n", "field_number",
                     absl::StrCat(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateHashCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
        "case 0:\n"
        "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("hash = hashFields(hash, getExtensionFields());\n");
  }

  printer->Print("hash = (29 * hash) + getUnknownFields().hashCode();\n");
  printer->Print(
      "memoizedHashCode = hash;\n"
      "return hash;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");
}